

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.hpp
# Opt level: O2

ssize_t __thiscall
SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::write
          (ServerBase<asio::basic_stream_socket<asio::ip::tcp>_> *this,int __fd,void *__buf,
          size_t __n)

{
  Response *this_00;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  __shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session,_(__gnu_cxx::_Lock_policy)2>
  *p_Var1;
  shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response> response;
  __shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response,_(__gnu_cxx::_Lock_policy)2>
  local_90 [2];
  __shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request,_(__gnu_cxx::_Lock_policy)2>
  local_70;
  __shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response,_(__gnu_cxx::_Lock_policy)2>
  local_60;
  __shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session,_(__gnu_cxx::_Lock_policy)2>
  local_50 [2];
  
  p_Var1 = (__shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session,_(__gnu_cxx::_Lock_policy)2>
            *)CONCAT44(in_register_00000034,__fd);
  Connection::set_timeout
            ((p_Var1->_M_ptr->connection).
             super___shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,(this->config).timeout_content);
  this_00 = (Response *)operator_new(0x170);
  std::
  __shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(local_50,p_Var1);
  Response::Response(this_00,(shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session>
                              *)local_50,(this->config).timeout_content);
  std::
  __shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Response,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Response,SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::write(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Session>const&,std::function<void(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Response>,std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Request>)>&)::_lambda(SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Response*)_1_,void>
            ((__shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Response,(__gnu_cxx::_Lock_policy)2>
              *)local_90,this_00,(anon_class_8_1_8991fb9c_for__M_tp)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50[0]._M_refcount);
  std::
  __shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_60,local_90);
  std::
  __shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_70,
                 &(p_Var1->_M_ptr->request).
                  super___shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request,_(__gnu_cxx::_Lock_policy)2>
                );
  std::
  function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>,_std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>)>
  ::operator()((function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>,_std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>)>
                *)__buf,(shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>
                         *)&local_60,
               (shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>
                *)&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90[0]._M_refcount);
  return extraout_RAX;
}

Assistant:

void write(const std::shared_ptr<Session> &session,
               std::function<void(std::shared_ptr<typename ServerBase<socket_type>::Response>, std::shared_ptr<typename ServerBase<socket_type>::Request>)> &resource_function) {
      session->connection->set_timeout(config.timeout_content);
      auto response = std::shared_ptr<Response>(new Response(session, config.timeout_content), [this](Response *response_ptr) {
        auto response = std::shared_ptr<Response>(response_ptr);
        response->send_on_delete([this, response](const error_code &ec) {
          if(!ec) {
            if(response->close_connection_after_response)
              return;

            auto range = response->session->request->header.equal_range("Connection");
            for(auto it = range.first; it != range.second; it++) {
              if(case_insensitive_equal(it->second, "close"))
                return;
              else if(case_insensitive_equal(it->second, "keep-alive")) {
                auto new_session = std::make_shared<Session>(this->config.max_request_streambuf_size, response->session->connection);
                this->read(new_session);
                return;
              }
            }
            if(response->session->request->http_version >= "1.1") {
              auto new_session = std::make_shared<Session>(this->config.max_request_streambuf_size, response->session->connection);
              this->read(new_session);
              return;
            }
          }
          else if(this->on_error)
            this->on_error(response->session->request, ec);
        });
      });

      try {
        resource_function(response, session->request);
      }
      catch(const std::exception &) {
        if(on_error)
          on_error(session->request, make_error_code::make_error_code(errc::operation_canceled));
        return;
      }
    }